

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void pybind11::
     class_<std::vector<TangleView,_std::allocator<TangleView>_>,_std::unique_ptr<std::vector<TangleView,_std::allocator<TangleView>_>,_std::default_delete<std::vector<TangleView,_std::allocator<TangleView>_>_>_>_>
     ::init_holder(instance *inst,value_and_holder *v_h,holder_type *holder_ptr,void *param_4)

{
  unique_ptr<std::vector<TangleView,_std::allocator<TangleView>_>,_std::default_delete<std::vector<TangleView,_std::allocator<TangleView>_>_>_>
  *this;
  long in_RDX;
  value_and_holder *in_RSI;
  long in_RDI;
  pointer in_stack_ffffffffffffffc8;
  
  if (in_RDX == 0) {
    if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
      this = pybind11::detail::value_and_holder::
             holder<std::unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>>
                       (in_RSI);
      pybind11::detail::value_and_holder::
      value_ptr<std::vector<TangleView,std::allocator<TangleView>>>(in_RSI);
      std::
      unique_ptr<std::vector<TangleView,std::allocator<TangleView>>,std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>>
      ::unique_ptr<std::default_delete<std::vector<TangleView,std::allocator<TangleView>>>,void>
                (this,in_stack_ffffffffffffffc8);
      pybind11::detail::value_and_holder::set_holder_constructed(in_RSI,true);
    }
  }
  else {
    init_holder_from_existing(in_RSI,in_RDX);
    pybind11::detail::value_and_holder::set_holder_constructed(in_RSI,true);
  }
  return;
}

Assistant:

static void init_holder(detail::instance *inst, detail::value_and_holder &v_h,
            const holder_type *holder_ptr, const void * /* dummy -- not enable_shared_from_this<T>) */) {
        if (holder_ptr) {
            init_holder_from_existing(v_h, holder_ptr, std::is_copy_constructible<holder_type>());
            v_h.set_holder_constructed();
        } else if (inst->owned || detail::always_construct_holder<holder_type>::value) {
            new (std::addressof(v_h.holder<holder_type>())) holder_type(v_h.value_ptr<type>());
            v_h.set_holder_constructed();
        }
    }